

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

IVal * deqp::gls::BuiltinPrecisionTests::
       ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doRound
                 (IVal *__return_storage_ptr__,FloatFormat *fmt,Matrix<float,_2,_2> *value)

{
  bool *pbVar1;
  double *pdVar2;
  Vector<float,_2> *in_RCX;
  long lVar3;
  IVal local_58;
  
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix(__return_storage_ptr__);
  for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 6) {
    round<tcu::Vector<float,2>>(&local_58,(BuiltinPrecisionTests *)fmt,(FloatFormat *)value,in_RCX);
    pdVar2 = &(__return_storage_ptr__->m_data).m_data[0].m_data[1].m_lo + lVar3;
    *pdVar2 = local_58.m_data[1].m_lo;
    pdVar2[1] = local_58.m_data[1].m_hi;
    pdVar2 = &(__return_storage_ptr__->m_data).m_data[0].m_data[0].m_hi + lVar3;
    *pdVar2 = local_58.m_data[0].m_hi;
    pdVar2[1] = (double)local_58.m_data[1]._0_8_;
    pbVar1 = &(__return_storage_ptr__->m_data).m_data[0].m_data[0].m_hasNaN + lVar3 * 8;
    *(undefined8 *)pbVar1 = local_58.m_data[0]._0_8_;
    *(double *)(pbVar1 + 8) = local_58.m_data[0].m_lo;
    value = (Matrix<float,_2,_2> *)&((FloatFormat *)value)->m_fractionBits;
  }
  return __return_storage_ptr__;
}

Assistant:

static IVal			doRound			(const FloatFormat& fmt, T value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = round(fmt, value[ndx]);

		return ret;
	}